

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O2

bool basisu::uastc_rdo_blocks
               (uint32_t first_index,uint32_t last_index,uastc_block *pBlocks,
               color_rgba *pBlock_pixels,uastc_rdo_params *params,uint32_t flags,
               uint32_t *total_skipped,uint32_t *total_refined,uint32_t *total_modified,
               uint32_t *total_smooth)

{
  color_rgba *block;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint32_t i_1;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  iterator iVar8;
  uint64_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  long lVar12;
  int *piVar13;
  unpacked_uastc_block *puVar14;
  uastc_block *blk;
  uint8_t *puVar15;
  uint64_t uVar16;
  color32 *pPixels;
  color_rgba (*decoded_uastc_block_00) [4];
  uint32_t mul_search_rad;
  long lVar17;
  undefined8 uVar18;
  uastc_block *blk_00;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  byte bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  pair<std::__detail::_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>,_bool>
  pVar29;
  uint8_t *puStackY_580;
  uint in_stack_fffffffffffffa88;
  bool bc1_hint1;
  uint32_t bit_offset;
  uint local_558;
  float local_554;
  float local_550;
  uint32_t local_54c;
  uastc_block trial_blk;
  float local_524;
  uint local_520;
  uint32_t cur_bit_offset;
  uastc_block best_block;
  bc7_block trial_b7_block;
  unpacked_uastc_block unpacked_prev_blk;
  tracked_stat local_3f8;
  tracked_stat local_3e0;
  tracked_stat local_3c8;
  tracked_stat local_3b0;
  color_rgba decoded_trial_b7_blk [4] [4];
  color_rgba decoded_trial_uastc_block [4] [4];
  unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
  selector_history;
  bc7_optimization_results trial_b7_results;
  uint8_t local_260 [8];
  unpacked_uastc_block unpacked_trial_blk;
  bc7_block b7_block;
  unpacked_uastc_block unpacked_blk;
  color_rgba decoded_b7_blk [4] [4];
  color_rgba decoded_uastc_block [4] [4];
  bc7_optimization_results b7_results;
  
  bVar25 = 0;
  uVar24 = (ulong)first_index;
  debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n",uVar24);
  uVar4 = params->m_lz_dict_size >> 4;
  selector_history._M_h._M_buckets = &selector_history._M_h._M_single_bucket;
  selector_history._M_h._M_bucket_count = 1;
  selector_history._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  selector_history._M_h._M_element_count = 0;
  selector_history._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  selector_history._M_h._M_rehash_policy._M_next_resize = 0;
  selector_history._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_558 = flags & 0xf;
  uVar11 = first_index << 4;
  while( true ) {
    uVar21 = (uint)uVar24;
    if (last_index <= uVar21) break;
    blk = pBlocks + uVar24;
    bVar3 = basist::unpack_uastc(blk,&unpacked_blk,false,true);
    if (!bVar3) break;
    uVar24 = (ulong)unpacked_blk.m_mode;
    if (uVar24 != 8) {
      block = pBlock_pixels + (uVar21 << 4);
      local_3f8.m_total2 = 0;
      local_3f8.m_total = 0;
      local_3e0.m_total2 = 0;
      local_3e0.m_total = 0;
      uVar16 = 0;
      local_3c8.m_total = 0;
      local_3b0.m_total2 = 0;
      local_3b0.m_total = 0;
      for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
        bVar1 = pBlock_pixels[(ulong)uVar11 + lVar17].field_0.field_1.r;
        local_3b0.m_total = local_3b0.m_total + bVar1;
        local_3b0.m_total2 = local_3b0.m_total2 + (uint)bVar1 * (uint)bVar1;
        bVar1 = pBlock_pixels[(ulong)uVar11 + lVar17].field_0.m_comps[1];
        local_3c8.m_total = local_3c8.m_total + bVar1;
        uVar16 = uVar16 + (uint)bVar1 * (uint)bVar1;
        bVar1 = pBlock_pixels[(ulong)uVar11 + lVar17].field_0.m_comps[2];
        local_3e0.m_total = local_3e0.m_total + bVar1;
        local_3e0.m_total2 = local_3e0.m_total2 + (uint)bVar1 * (uint)bVar1;
        bVar1 = pBlock_pixels[(ulong)uVar11 + lVar17].field_0.m_comps[3];
        local_3f8.m_total = local_3f8.m_total + bVar1;
        local_3f8.m_total2 = local_3f8.m_total2 + (uint)bVar1 * (uint)bVar1;
      }
      local_3f8.m_num = 0x10;
      local_3e0.m_num = local_3f8.m_num;
      local_3c8.m_num = local_3f8.m_num;
      local_3c8.m_total2 = uVar16;
      local_3b0.m_num = local_3f8.m_num;
      fVar26 = tracked_stat::get_std_dev(&local_3b0);
      fVar27 = tracked_stat::get_std_dev(&local_3c8);
      if (fVar26 <= fVar27) {
        fVar26 = fVar27;
      }
      fVar27 = tracked_stat::get_std_dev(&local_3e0);
      if (fVar26 <= fVar27) {
        fVar26 = fVar27;
      }
      fVar27 = tracked_stat::get_std_dev(&local_3f8);
      if (fVar26 <= fVar27) {
        fVar26 = fVar27;
      }
      fVar26 = fVar26 / params->m_max_smooth_block_std_dev;
      fVar27 = 1.0;
      if (fVar26 <= 1.0) {
        fVar27 = fVar26;
      }
      fVar27 = (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar27);
      fVar26 = (1.0 - params->m_smooth_block_max_error_scale) * fVar27 * fVar27 +
               params->m_smooth_block_max_error_scale;
      if (1.0 < fVar26) {
        *total_smooth = *total_smooth + 1;
      }
      bVar3 = basist::unpack_uastc(&unpacked_blk,(color32 *)decoded_uastc_block,false);
      if (!bVar3) break;
      lVar12 = 0;
      for (lVar22 = 0; lVar22 != 0x40; lVar22 = lVar22 + 4) {
        uVar5 = color_distance((color_rgba *)((long)&pBlock_pixels[uVar11].field_0 + lVar22),
                               (color_rgba *)((long)&decoded_uastc_block[0][0].field_0 + lVar22),
                               true);
        lVar12 = lVar12 + (ulong)uVar5;
      }
      bVar3 = basist::transcode_uastc_to_bc7(&unpacked_blk,&b7_results);
      if (!bVar3) break;
      basist::encode_bc7_block(&b7_block,&b7_results);
      unpack_block(cBC7,&b7_block,decoded_b7_blk[0]);
      lVar23 = 0;
      for (lVar22 = 0; lVar22 != 0x40; lVar22 = lVar22 + 4) {
        uVar5 = color_distance((color_rgba *)((long)&pBlock_pixels[uVar11].field_0 + lVar22),
                               (color_rgba *)((long)&decoded_b7_blk[0][0].field_0 + lVar22),true);
        lVar23 = lVar23 + (ulong)uVar5;
      }
      local_550 = (float)((ulong)(lVar23 + lVar12) >> 1) * 0.015625;
      if (local_550 < 0.0) {
        local_554 = sqrtf(local_550);
      }
      else {
        local_554 = SQRT(local_550);
      }
      bVar1 = g_uastc_mode_selector_bits[uVar24 * 2];
      bVar2 = g_uastc_mode_selector_bits[uVar24 * 2 + 1];
      if (0x80 < (uint)bVar2 + (uint)bVar1) {
        __assert_fail("first_sel_bit + total_sel_bits <= 128",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                      ,0xf53,
                      "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                     );
      }
      if (bVar2 == 0) {
        __assert_fail("total_sel_bits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                      ,0xf54,
                      "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                     );
      }
      uVar5 = (uint)bVar1;
      local_54c = 0x40;
      if (bVar2 < 0x40) {
        local_54c = (uint)bVar2;
      }
      cur_bit_offset = uVar5;
      unpacked_prev_blk.m_astc._0_8_ = read_bits((uint8_t *)blk,&cur_bit_offset,local_54c);
      unpacked_prev_blk.m_astc.m_partition_seed = uVar5;
      if (params->m_skip_block_rms_thresh <= local_554) {
        unpacked_prev_blk.m_astc.m_ccs = uVar21;
        pVar29 = std::
                 _Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<std::pair<basisu::selector_bitsequence,unsigned_int>>
                           ((_Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)&selector_history,&unpacked_prev_blk);
        if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          *(uint *)((long)pVar29.first.
                          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                   + 0x18) = uVar21;
        }
        *total_skipped = *total_skipped + 1;
        goto LAB_0024a0a6;
      }
      iVar8 = std::
              _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&selector_history._M_h,(key_type *)&unpacked_prev_blk);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
          ._M_cur == (__node_type *)0x0) {
        uVar6 = (params->m_lz_literal_cost * (uint)bVar2) / 100;
      }
      else {
        uVar6 = compute_match_cost_estimate
                          ((uVar21 - *(int *)((long)iVar8.
                                                  super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                                                  ._M_cur + 0x18)) * 0x10);
      }
      uVar10 = uVar21 - (uVar4 + (uVar4 == 0));
      if ((int)uVar10 < (int)first_index) {
        uVar10 = first_index;
      }
      best_block.field_0._0_8_ = *(undefined8 *)&blk->field_0;
      best_block.field_0._8_8_ = *(undefined8 *)((long)&blk->field_0 + 8);
      fVar27 = local_550 * fVar26;
      local_550 = (float)(bVar2 - 0x40);
      uVar5 = uVar21;
      local_524 = (float)(int)uVar6 * params->m_lambda + fVar27;
      local_520 = uVar21;
      while( true ) {
        mul_search_rad = (uint32_t)lVar17;
        uVar6 = (uint32_t)uVar16;
        uVar5 = uVar5 - 1;
        if ((int)uVar5 < (int)uVar10) break;
        blk_00 = pBlocks + (int)uVar5;
        uVar7 = (uint)bVar1;
        bit_offset = uVar7;
        uVar9 = read_bits((uint8_t *)blk_00,&bit_offset,local_54c);
        unpacked_prev_blk.m_astc._0_8_ = uVar9;
        unpacked_prev_blk.m_astc.m_partition_seed = uVar7;
        iVar8 = std::
                _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&selector_history._M_h,(key_type *)&unpacked_prev_blk);
        uVar20 = uVar5;
        if ((iVar8.
             super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
             ._M_cur == (__node_type *)0x0) ||
           (uVar20 = *(uint *)((long)iVar8.
                                     super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                                     ._M_cur + 0x18), (int)uVar20 <= (int)uVar5)) {
          bVar3 = basist::unpack_uastc(blk_00,&unpacked_prev_blk,false,true);
          if (!bVar3) goto LAB_0024a0bb;
          trial_blk.field_0._0_8_ = *(undefined8 *)&blk->field_0;
          trial_blk.field_0._8_8_ = *(undefined8 *)((long)&blk->field_0 + 8);
          set_block_bits((uint8_t *)&trial_blk,uVar9,local_54c,uVar7);
          fVar27 = local_550;
          if (0x40 < bVar2) {
            uVar9 = read_bits((uint8_t *)blk_00,&bit_offset,(uint32_t)local_550);
            set_block_bits((uint8_t *)&trial_blk,uVar9,(uint32_t)fVar27,bVar1 + 0x40);
          }
          bVar3 = basist::unpack_uastc(&trial_blk,&unpacked_trial_blk,false,true);
          if ((bVar3) &&
             (bVar3 = basist::unpack_uastc
                                (&unpacked_trial_blk,(color32 *)decoded_trial_uastc_block,false),
             bVar3)) {
            lVar22 = 0;
            for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 4) {
              uVar7 = color_distance((color_rgba *)((long)&pBlock_pixels[uVar11].field_0 + lVar12),
                                     (color_rgba *)
                                     ((long)&decoded_trial_uastc_block[0][0].field_0 + lVar12),true)
              ;
              lVar22 = lVar22 + (ulong)uVar7;
            }
            bVar3 = basist::transcode_uastc_to_bc7(&unpacked_trial_blk,&trial_b7_results);
            if (!bVar3) goto LAB_0024a0bb;
            basist::encode_bc7_block(&trial_b7_block,&trial_b7_results);
            unpack_block(cBC7,&trial_b7_block,decoded_trial_b7_blk[0]);
            lVar23 = 0;
            for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 4) {
              uVar7 = color_distance((color_rgba *)((long)&pBlock_pixels[uVar11].field_0 + lVar12),
                                     (color_rgba *)
                                     ((long)&decoded_trial_b7_blk[0][0].field_0 + lVar12),true);
              lVar23 = lVar23 + (ulong)uVar7;
            }
            fVar27 = (float)((ulong)(lVar23 + lVar22) >> 1) * 0.015625;
            if (fVar27 < 0.0) {
              fVar28 = sqrtf(fVar27);
            }
            else {
              fVar28 = SQRT(fVar27);
            }
            if (fVar28 <= params->m_max_allowed_rms_increase_ratio * local_554) {
              uVar6 = compute_match_cost_estimate((uVar21 - uVar20) * 0x10);
              fVar27 = (float)(int)uVar6 * params->m_lambda + fVar27 * fVar26;
              if (fVar27 < local_524) {
                best_block.field_0._0_8_ = trial_blk.field_0._0_8_;
                best_block.field_0._8_8_ = trial_blk.field_0._8_8_;
                local_524 = fVar27;
                local_520 = uVar5;
              }
            }
          }
        }
      }
      if (local_520 != uVar21) {
        *total_modified = *total_modified + 1;
        bVar3 = basist::unpack_uastc(&best_block,&unpacked_trial_blk,false,false);
        if (!bVar3) break;
        if ((uVar24 == 0) && (params->m_endpoint_refinement != false)) {
          bVar3 = basist::unpack_uastc(&unpacked_trial_blk,(color32 *)&trial_b7_results,false);
          if (!bVar3) break;
          uVar24 = 0;
          for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 4) {
            uVar5 = color_distance((color_rgba *)((long)&pBlock_pixels[uVar11].field_0 + lVar17),
                                   (color_rgba *)(trial_b7_results.m_selectors + lVar17 + -8),true);
            uVar24 = uVar24 + uVar5;
          }
          decoded_trial_b7_blk[0][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x40;
          decoded_trial_b7_blk[0][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x1;
          decoded_trial_b7_blk[0][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x1;
          decoded_trial_b7_blk[0][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x1;
          decoded_trial_b7_blk[1][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x1;
          decoded_trial_b7_blk[1][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
          decoded_trial_b7_blk[1][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
          decoded_trial_b7_blk[1][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x1;
          trial_blk.field_0._0_8_ = trial_blk.field_0._0_8_ & 0xffffffff00000000;
          astc_mode0_or_18(0,(color_rgba (*) [4])block,(uastc_encode_results *)&unpacked_prev_blk,
                           (uint32_t *)&trial_blk,
                           (bc7enc_compress_block_params *)decoded_trial_b7_blk,
                           unpacked_trial_blk.m_astc.m_weights);
          if (trial_blk.field_0.m_dwords[0] != 1) {
            __assert_fail("total_results == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                          ,0xff0,
                          "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                         );
          }
          trial_b7_block.m_qwords[0] =
               CONCAT44(trial_b7_block.m_qwords[0]._4_4_,unpacked_prev_blk.m_solid_color.field_0);
          pPixels = (color32 *)decoded_trial_uastc_block;
          uVar18 = 0;
          bVar3 = basist::unpack_uastc
                            (unpacked_prev_blk.m_astc.m_weight_range,
                             unpacked_prev_blk.m_astc.m_subsets,(color32 *)&trial_b7_block,
                             (astc_block_desc *)&unpacked_prev_blk.m_astc.m_partition_seed,pPixels,
                             false);
          if (!bVar3) {
            __assert_fail("success",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                          ,0xff6,
                          "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                         );
          }
          lVar17 = 0;
          uVar19 = 0;
          while( true ) {
            mul_search_rad = (uint32_t)uVar18;
            uVar6 = (uint32_t)pPixels;
            if (lVar17 == 0x40) break;
            uVar5 = color_distance((color_rgba *)((long)&pBlock_pixels[uVar11].field_0 + lVar17),
                                   (color_rgba *)
                                   ((long)&decoded_trial_uastc_block[0][0].field_0 + lVar17),true);
            uVar19 = uVar19 + uVar5;
            lVar17 = lVar17 + 4;
          }
          if (uVar19 < uVar24) {
            lVar17 = 0x2f;
            while (lVar17 != 0x3f) {
              lVar12 = lVar17 + -0x1d;
              lVar22 = lVar17 + -0x15;
              lVar17 = lVar17 + 1;
              if (unpacked_trial_blk.m_astc.m_endpoints[lVar12] !=
                  unpacked_prev_blk.m_astc.m_endpoints[lVar22]) {
                __assert_fail("unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                              ,0x1004,
                              "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                             );
              }
            }
            piVar13 = &unpacked_prev_blk.m_astc.m_partition_seed;
            puVar14 = &unpacked_trial_blk;
            for (lVar17 = 0x1a; lVar17 != 0; lVar17 = lVar17 + -1) {
              (puVar14->m_astc).m_weight_range = *piVar13;
              piVar13 = piVar13 + (ulong)bVar25 * -2 + 1;
              puVar14 = (unpacked_uastc_block *)((long)puVar14 + (ulong)bVar25 * -8 + 4);
            }
            *total_refined = *total_refined + 1;
          }
        }
        memcpy(&unpacked_prev_blk,&unpacked_trial_blk,0x98);
        bVar3 = basist::unpack_uastc(&unpacked_prev_blk,(color32 *)decoded_trial_uastc_block,false);
        if (!bVar3) break;
        puVar14 = &unpacked_prev_blk;
        puVar15 = trial_b7_results.m_selectors;
        for (lVar17 = 0x1a; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(int *)puVar15 = (puVar14->m_astc).m_weight_range;
          puVar14 = (unpacked_uastc_block *)((long)puVar14 + (ulong)bVar25 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar25 * -8 + 4;
        }
        local_260[0] = '\0';
        local_260[1] = '\0';
        local_260[2] = '\0';
        local_260[3] = '\0';
        local_260[4] = '\0';
        local_260[5] = '\0';
        local_260[6] = '\0';
        local_260[7] = '\0';
        puStackY_580 = (uint8_t *)0x3;
        uVar10 = 0xffffffff;
        switch(local_558) {
        case 0:
          puStackY_580 = (uint8_t *)0x0;
          bit_offset = (uint)bit_offset._1_3_ << 8;
          bc1_hint1 = false;
          uVar10 = 0x2904;
          goto LAB_00249f21;
        case 1:
          uVar10 = 0x2904;
          puStackY_580 = (uint8_t *)0x0;
          break;
        case 2:
          uVar10 = 0x2dc5;
          puStackY_580 = (uint8_t *)0x1;
          break;
        case 3:
          puStackY_580 = (uint8_t *)0x2;
        }
        bit_offset = (uint)bit_offset._1_3_ << 8;
        bc1_hint1 = false;
        decoded_uastc_block_00 = decoded_trial_uastc_block;
        compute_bc1_hints((bool *)&bit_offset,&bc1_hint1,(uastc_encode_results *)&trial_b7_results,
                          (color_rgba (*) [4])block,decoded_uastc_block_00);
        uVar6 = (uint32_t)decoded_uastc_block_00;
LAB_00249f21:
        if ((unpacked_prev_blk.m_mode == 8) ||
           (basist::g_uastc_mode_has_alpha[unpacked_prev_blk.m_mode] == '\0')) {
          trial_b7_block.m_qwords[0] = 0;
        }
        else {
          for (uVar24 = 0; uVar24 != 0x10; uVar24 = uVar24 + 1) {
            decoded_trial_b7_blk[0][0].field_0.m_comps[uVar24] =
                 decoded_trial_uastc_block[uVar24 >> 2 & 0x3fffffff][(uint)uVar24 & 3].field_0.
                 m_comps[3];
          }
          trial_blk.field_0._8_8_ = trial_blk.field_0._8_8_ & 0xffffffff00000000;
          trial_blk.field_0._0_8_ = 0;
          uastc_pack_eac_a8((basisu *)&trial_blk,(uastc_pack_eac_a8_results *)decoded_trial_b7_blk,
                            puStackY_580,uVar10,uVar6,mul_search_rad,in_stack_fffffffffffffa88);
          trial_b7_block.m_qwords[0] =
               CONCAT62(trial_b7_block.m_qwords[0]._2_6_,
                        (ushort)(trial_blk.field_0.m_dwords[2] << 0xc) |
                        (ushort)((trial_blk.field_0.m_dwords[1] & 0xf) << 8));
        }
        trial_blk.field_0._0_8_ = trial_blk.field_0._0_8_ & 0xffffffff00000000;
        compute_etc1_hints((etc_block *)decoded_trial_b7_blk,(uint32_t *)&trial_blk,
                           (uastc_encode_results *)&trial_b7_results,(color_rgba (*) [4])block,
                           decoded_trial_uastc_block,local_558,flags);
        in_stack_fffffffffffffa88 = (uint)bc1_hint1;
        pack_uastc(&best_block,(uastc_encode_results *)&trial_b7_results,
                   (etc_block *)decoded_trial_b7_blk,trial_blk.field_0.m_dwords[0],
                   (eac_a8_block *)&trial_b7_block,bit_offset._0_1_,bc1_hint1);
        *(undefined8 *)&blk->field_0 = best_block.field_0._0_8_;
        *(undefined8 *)((long)&blk->field_0 + 8) = best_block.field_0._8_8_;
      }
      unpacked_trial_blk.m_astc.m_weight_range = (uint)bVar1;
      unpacked_prev_blk.m_astc._0_8_ =
           read_bits((uint8_t *)&best_block,(uint32_t *)&unpacked_trial_blk,local_54c);
      unpacked_prev_blk.m_astc.m_partition_seed = (uint)bVar1;
      unpacked_prev_blk.m_astc.m_ccs = uVar21;
      pVar29 = std::
               _Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<std::pair<basisu::selector_bitsequence,unsigned_int>>
                         ((_Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&selector_history,&unpacked_prev_blk);
      if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        *(uint *)((long)pVar29.first.
                        super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                 + 0x18) = uVar21;
      }
    }
LAB_0024a0a6:
    uVar24 = (ulong)(uVar21 + 1);
    uVar11 = uVar11 + 0x10;
  }
LAB_0024a0bb:
  std::
  _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&selector_history._M_h);
  return last_index <= uVar21;
}

Assistant:

static bool uastc_rdo_blocks(uint32_t first_index, uint32_t last_index, basist::uastc_block* pBlocks, const color_rgba* pBlock_pixels, const uastc_rdo_params& params, uint32_t flags, 
		uint32_t &total_skipped, uint32_t &total_refined, uint32_t &total_modified, uint32_t &total_smooth)
	{
		debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n", first_index, last_index);

		const int total_blocks_to_check = basisu::maximum<uint32_t>(1U, params.m_lz_dict_size / sizeof(basist::uastc_block));
		const bool perceptual = false;

		std::unordered_map<selector_bitsequence, uint32_t, selector_bitsequence_hash> selector_history;
						
		for (uint32_t block_index = first_index; block_index < last_index; block_index++)
		{
			const basist::uastc_block& blk = pBlocks[block_index];
			const color_rgba* pPixels = &pBlock_pixels[16 * block_index];

			unpacked_uastc_block unpacked_blk;
			if (!unpack_uastc(blk, unpacked_blk, false, true))
				return false;

			const uint32_t block_mode = unpacked_blk.m_mode;
			if (block_mode == UASTC_MODE_INDEX_SOLID_COLOR)
				continue;

			tracked_stat r_stats, g_stats, b_stats, a_stats;

			for (uint32_t i = 0; i < 16; i++)
			{
				r_stats.update(pPixels[i].r);
				g_stats.update(pPixels[i].g);
				b_stats.update(pPixels[i].b);
				a_stats.update(pPixels[i].a);
			}

			const float max_std_dev = basisu::maximum<float>(basisu::maximum<float>(basisu::maximum(r_stats.get_std_dev(), g_stats.get_std_dev()), b_stats.get_std_dev()), a_stats.get_std_dev());

			float yl = clamp<float>(max_std_dev / params.m_max_smooth_block_std_dev, 0.0f, 1.0f);
			yl = yl * yl;
			const float smooth_block_error_scale = lerp<float>(params.m_smooth_block_max_error_scale, 1.0f, yl);
			if (smooth_block_error_scale > 1.0f)
				total_smooth++;

			color_rgba decoded_uastc_block[4][4];
			if (!unpack_uastc(unpacked_blk, (basist::color32*)decoded_uastc_block, false))
				return false;

			uint64_t uastc_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_uastc_block)[i], true);

			// Transcode to BC7
			bc7_optimization_results b7_results;
			if (!transcode_uastc_to_bc7(unpacked_blk, b7_results))
				return false;

			basist::bc7_block b7_block;
			basist::encode_bc7_block(&b7_block, &b7_results);

			color_rgba decoded_b7_blk[4][4];
			unpack_block(texture_format::cBC7, &b7_block, &decoded_b7_blk[0][0]);
						
			uint64_t bc7_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_b7_blk)[i], true);

			uint64_t cur_err = (uastc_err + bc7_err) / 2;

			// Divide by 16*4 to compute RMS error
			const float cur_ms_err = (float)cur_err * (1.0f / 64.0f);
			const float cur_rms_err = sqrt(cur_ms_err);

			const uint32_t first_sel_bit = g_uastc_mode_selector_bits[block_mode][0];
			const uint32_t total_sel_bits = g_uastc_mode_selector_bits[block_mode][1];
			assert(first_sel_bit + total_sel_bits <= 128);
			assert(total_sel_bits > 0);

			uint32_t cur_bit_offset = first_sel_bit;
			uint64_t cur_sel_bits = read_bits((const uint8_t*)&blk, cur_bit_offset, basisu::minimum(64U, total_sel_bits));

			if (cur_rms_err >= params.m_skip_block_rms_thresh)
			{
				auto cur_search_res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, cur_sel_bits), block_index));

				// Block already has too much error, so don't mess with it.
				if (!cur_search_res.second)
					(*cur_search_res.first).second = block_index;

				total_skipped++;
				continue;
			}

			int cur_bits;
			auto cur_find_res = selector_history.find(selector_bitsequence(first_sel_bit, cur_sel_bits));
			if (cur_find_res == selector_history.end())
			{
				// Wasn't found - wildly estimate literal cost
				//cur_bits = (total_sel_bits * 5) / 4;
				cur_bits = (total_sel_bits * params.m_lz_literal_cost) / 100;
			}
			else
			{
				// Was found - wildly estimate match cost
				uint32_t match_block_index = cur_find_res->second;
				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				cur_bits = compute_match_cost_estimate(block_dist_in_bytes);
			}

			int first_block_to_check = basisu::maximum<int>(first_index, block_index - total_blocks_to_check);
			int last_block_to_check = block_index - 1;

			basist::uastc_block best_block(blk);
			uint32_t best_block_index = block_index;

			float best_t = cur_ms_err * smooth_block_error_scale + cur_bits * params.m_lambda;

			// Now scan through previous blocks, insert their selector bit patterns into the current block, and find 
			// selector bit patterns which don't increase the overall block error too much.
			for (int prev_block_index = last_block_to_check; prev_block_index >= first_block_to_check; --prev_block_index)
			{
				const basist::uastc_block& prev_blk = pBlocks[prev_block_index];

				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, basisu::minimum(64U, total_sel_bits));

				int match_block_index = prev_block_index;
				auto res = selector_history.find(selector_bitsequence(first_sel_bit, sel_bits));
				if (res != selector_history.end())
					match_block_index = res->second;
				// Have we already checked this bit pattern? If so then skip this block.
				if (match_block_index > prev_block_index)
					continue;

				unpacked_uastc_block unpacked_prev_blk;
				if (!unpack_uastc(prev_blk, unpacked_prev_blk, false, true))
					return false;

				basist::uastc_block trial_blk(blk);

				set_block_bits((uint8_t*)&trial_blk, sel_bits, basisu::minimum(64U, total_sel_bits), first_sel_bit);

				if (total_sel_bits > 64)
				{
					sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, total_sel_bits - 64U);

					set_block_bits((uint8_t*)&trial_blk, sel_bits, total_sel_bits - 64U, first_sel_bit + basisu::minimum(64U, total_sel_bits));
				}

				unpacked_uastc_block unpacked_trial_blk;
				if (!unpack_uastc(trial_blk, unpacked_trial_blk, false, true))
					continue;

				color_rgba decoded_trial_uastc_block[4][4];
				if (!unpack_uastc(unpacked_trial_blk, (basist::color32*)decoded_trial_uastc_block, false))
					continue;

				uint64_t trial_uastc_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

				// Transcode trial to BC7, compute error
				bc7_optimization_results trial_b7_results;
				if (!transcode_uastc_to_bc7(unpacked_trial_blk, trial_b7_results))
					return false;

				basist::bc7_block trial_b7_block;
				basist::encode_bc7_block(&trial_b7_block, &trial_b7_results);

				color_rgba decoded_trial_b7_blk[4][4];
				unpack_block(texture_format::cBC7, &trial_b7_block, &decoded_trial_b7_blk[0][0]);

				uint64_t trial_bc7_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_b7_blk)[i], true);

				uint64_t trial_err = (trial_uastc_err + trial_bc7_err) / 2;

				const float trial_ms_err = (float)trial_err * (1.0f / 64.0f);
				const float trial_rms_err = sqrtf(trial_ms_err);

				if (trial_rms_err > cur_rms_err * params.m_max_allowed_rms_increase_ratio)
					continue;

				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				const int match_bits = compute_match_cost_estimate(block_dist_in_bytes);

				float t = trial_ms_err * smooth_block_error_scale + match_bits * params.m_lambda;
				if (t < best_t)
				{
					best_t = t;
					best_block_index = prev_block_index;

					best_block = trial_blk;
				}

			} // prev_block_index

			if (best_block_index != block_index)
			{
				total_modified++;

				unpacked_uastc_block unpacked_best_blk;
				if (!unpack_uastc(best_block, unpacked_best_blk, false, false))
					return false;

				if ((params.m_endpoint_refinement) && (block_mode == 0))
				{
					// Attempt to refine mode 0 block's endpoints, using the new selectors. This doesn't help much, but it does help.
					// TODO: We could do this with the other modes too.
					color_rgba decoded_best_uastc_block[4][4];
					if (!unpack_uastc(unpacked_best_blk, (basist::color32*)decoded_best_uastc_block, false))
						return false;

					// Compute the block's current error (with the modified selectors).
					uint64_t best_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						best_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_best_uastc_block)[i], true);

					bc7enc_compress_block_params comp_params;
					memset(&comp_params, 0, sizeof(comp_params));
					comp_params.m_max_partitions_mode1 = 64;
					comp_params.m_least_squares_passes = 1;
					comp_params.m_weights[0] = 1;
					comp_params.m_weights[1] = 1;
					comp_params.m_weights[2] = 1;
					comp_params.m_weights[3] = 1;
					comp_params.m_uber_level = 0;

					uastc_encode_results results;
					uint32_t total_results = 0;
					astc_mode0_or_18(0, (color_rgba(*)[4])pPixels, &results, total_results, comp_params, unpacked_best_blk.m_astc.m_weights);
					assert(total_results == 1);

					// See if the overall error has actually gone done.

					color_rgba decoded_trial_uastc_block[4][4];
					bool success = unpack_uastc(results.m_uastc_mode, results.m_common_pattern, results.m_solid_color.get_color32(), results.m_astc, (basist::color32*) & decoded_trial_uastc_block[0][0], false);
					assert(success);
					
					BASISU_NOTE_UNUSED(success);

					uint64_t trial_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

					if (trial_uastc_err < best_uastc_err)
					{
						// The error went down, so accept the new endpoints.

						// Ensure the selectors haven't changed, otherwise we'll invalidate the LZ matches.
						for (uint32_t i = 0; i < 16; i++)
							assert(unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]);

						unpacked_best_blk.m_astc = results.m_astc;

						total_refined++;
					}
				} // if ((params.m_endpoint_refinement) && (block_mode == 0))

				// The selectors have changed, so go recompute the block hints.
				if (!uastc_recompute_hints(&best_block, pPixels, flags, &unpacked_best_blk))
					return false;

				// Write the modified block
				pBlocks[block_index] = best_block;
			
			} // if (best_block_index != block_index)

			{
				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&best_block, bit_offset, basisu::minimum(64U, total_sel_bits));

				auto res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, sel_bits), block_index));
				if (!res.second)
					(*res.first).second = block_index;
			}

		} // block_index

		return true;
	}